

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void pybind11::detail::add_class_method(object *cls,char *name_,cpp_function *cf)

{
  bool bVar1;
  int iVar2;
  obj_attr_accessor local_50;
  handle local_30;
  
  cpp_function::name((cpp_function *)&local_30);
  object_api<pybind11::handle>::attr(&local_50,(object_api<pybind11::handle> *)cls,local_30);
  accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_50,cf);
  accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_50);
  object::~object((object *)&local_30);
  iVar2 = strcmp(name_,"__eq__");
  if (iVar2 == 0) {
    local_50.obj.m_ptr = (cls->super_handle).m_ptr;
    local_50.key.super_handle.m_ptr = (handle)(PyObject *)0x472b1f;
    local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
    bVar1 = object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
            contains<char_const(&)[9]>
                      ((object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>
                        *)&local_50,(char (*) [9])"__hash__");
    object::~object(&local_50.cache);
    if (!bVar1) {
      __Py_NoneStruct = __Py_NoneStruct + 1;
      local_30.m_ptr = (PyObject *)&_Py_NoneStruct;
      local_50.obj.m_ptr = (cls->super_handle).m_ptr;
      local_50.key.super_handle.m_ptr = (handle)(PyObject *)0x472b28;
      local_50.cache.super_handle.m_ptr = (handle)(PyObject *)0x0;
      accessor<pybind11::detail::accessor_policies::str_attr>::operator=
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&local_50,
                 (none *)&local_30);
      object::~object(&local_50.cache);
      object::~object((object *)&local_30);
    }
  }
  return;
}

Assistant:

inline void add_class_method(object& cls, const char *name_, const cpp_function &cf) {
    cls.attr(cf.name()) = cf;
    if (strcmp(name_, "__eq__") == 0 && !cls.attr("__dict__").contains("__hash__")) {
      cls.attr("__hash__") = none();
    }
}